

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O1

uint32 __thiscall MTRand::randInt(MTRand *this)

{
  ulong *puVar1;
  ulong uVar2;
  
  if (this->left == 0) {
    reload(this);
  }
  this->left = this->left + -1;
  puVar1 = this->pNext;
  this->pNext = puVar1 + 1;
  uVar2 = *puVar1;
  uVar2 = uVar2 >> 0xb ^ uVar2;
  uVar2 = ((uint)uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = ((uint)uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

MTRand::uint32 MTRand::randInt() {
  // Pull a 32-bit integer from the generator state
  // Every other access function simply transforms the numbers extracted here

  if (left == 0)
    reload();
  --left;

  uint32 s1;
  s1 = *pNext++;
  s1 ^= (s1 >> 11);
  s1 ^= (s1 << 7) & 0x9d2c5680UL;
  s1 ^= (s1 << 15) & 0xefc60000UL;
  return (s1 ^ (s1 >> 18));
}